

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugBreakButtonTooltip(bool keyboard_only,char *description_of_location)

{
  bool bVar1;
  char *in_RSI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = BeginItemTooltip();
  if (bVar1) {
    Text("To call IM_DEBUG_BREAK() %s:",in_RSI);
    Separator();
    TextUnformatted(in_RSI,in_stack_ffffffffffffffe8);
    Separator();
    TextUnformatted(in_RSI,in_stack_ffffffffffffffe8);
    EndTooltip();
  }
  return;
}

Assistant:

void ImGui::DebugBreakButtonTooltip(bool keyboard_only, const char* description_of_location)
{
    if (!BeginItemTooltip())
        return;
    Text("To call IM_DEBUG_BREAK() %s:", description_of_location);
    Separator();
    TextUnformatted(keyboard_only ? "- Press 'Pause/Break' on keyboard." : "- Press 'Pause/Break' on keyboard.\n- or Click (may alter focus/active id).\n- or navigate using keyboard and press space.");
    Separator();
    TextUnformatted("Choose one way that doesn't interfere with what you are trying to debug!\nYou need a debugger attached or this will crash!");
    EndTooltip();
}